

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astc_codec.cpp
# Opt level: O3

astcenc_profile astcEncoderProfile(ktxAstcParams *params,uint32_t *bdb)

{
  uint uVar1;
  astcenc_profile aVar2;
  int iVar3;
  
  uVar1 = (uint)((ulong)bdb >> 0x10) & 0xff;
  if (1 < uVar1 - 1) {
    __assert_fail("transfer == KHR_DF_TRANSFER_LINEAR && \"Unsupported transfer function, only support sRGB and Linear\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/astc_codec.cpp"
                  ,0x181,
                  "astcenc_profile astcEncoderProfile(const ktxAstcParams &, const uint32_t *)");
  }
  iVar3 = (int)params;
  aVar2 = ASTCENC_PRF_LDR_SRGB;
  if (iVar3 != 1 || uVar1 != 2) {
    if (uVar1 == 2) {
      if (iVar3 != 1) {
        __assert_fail("ldr && \"HDR sRGB profile not supported\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/astc_codec.cpp"
                      ,0x16a,"astcenc_profile astcProfile(bool, bool)");
      }
    }
    else {
      aVar2 = (uint)(iVar3 != 1) * 2 + ASTCENC_PRF_LDR;
    }
  }
  return aVar2;
}

Assistant:

static astcenc_profile
astcEncoderProfile(const ktxAstcParams &params, const uint32_t* bdb) {

    ktx_uint32_t transfer = KHR_DFDVAL(bdb, TRANSFER);

    bool sRGB = transfer == KHR_DF_TRANSFER_SRGB;
    bool ldr = params.mode == KTX_PACK_ASTC_ENCODER_MODE_LDR;

    if (!sRGB) {
        assert(transfer == KHR_DF_TRANSFER_LINEAR && "Unsupported transfer function, only support sRGB and Linear");
    }

    return astcProfile(sRGB, ldr);
}